

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

char * __thiscall Messages::Person::_InternalParse(Person *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  string *psVar4;
  Rep *pRVar5;
  undefined1 auVar6 [12];
  ArenaStringPtr *pAVar7;
  ArenaStringPtr *pAVar8;
  bool bVar9;
  Person_PhoneNumber *msg;
  char *pcVar10;
  char cVar11;
  uint uVar12;
  Arena *pAVar13;
  ulong uVar14;
  UnknownFieldSet *pUVar15;
  char cVar17;
  uint uVar18;
  StringPiece SVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  byte *local_58;
  InternalMetadata *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  RepeatedPtrField<Messages::Person_PhoneNumber> *local_38;
  pointer pcVar16;
  
  local_50 = (InternalMetadata *)&this->field_0x8;
  local_38 = &this->phones_;
  local_40 = &this->email_;
  local_48 = &this->name_;
  uVar12 = 0;
  local_58 = (byte *)ptr;
  do {
    bVar9 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_58,ctx->group_depth_);
    if (bVar9) goto LAB_00108c0b;
    bVar1 = *local_58;
    auVar20[8] = bVar1;
    auVar20._0_8_ = local_58 + 1;
    auVar20._9_3_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_58[1];
      uVar18 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        auVar20 = google::protobuf::internal::ReadTagFallback((char *)local_58,uVar18);
      }
      else {
        auVar20._8_4_ = uVar18;
        auVar20._0_8_ = local_58 + 2;
      }
    }
    pAVar8 = local_40;
    pAVar7 = local_48;
    uVar18 = auVar20._8_4_;
    local_58 = auVar20._0_8_;
    cVar11 = '\x04';
    if (local_58 != (byte *)0x0) {
      cVar17 = auVar20[8];
      switch(uVar18 >> 3) {
      case 1:
        if (cVar17 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar13 = *(Arena **)&this->field_0x8;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
          }
          if (local_48->ptr_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstance
                      (local_48,pAVar13,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
            ;
          }
          psVar4 = pAVar7->ptr_;
          local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       ((string *)psVar4,(char *)local_58,ctx);
          pcVar16 = (psVar4->_M_dataplus)._M_p;
          uVar14 = psVar4->_M_string_length;
          if ((long)uVar14 < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig(uVar14,"size_t to int conversion");
          }
          pcVar10 = "Messages.Person.name";
LAB_00108a69:
          SVar19.length_ = uVar14;
          SVar19.ptr_ = pcVar16;
          google::protobuf::internal::VerifyUTF8(SVar19,pcVar10);
LAB_00108bc2:
          cVar11 = (local_58 == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_00108bcc;
        }
        break;
      case 2:
        if (cVar17 == '\x10') {
          bVar1 = *local_58;
          auVar21._8_8_ = (long)(char)bVar1;
          auVar21._0_8_ = local_58 + 1;
          auVar6 = auVar21._0_12_;
          if ((long)(char)bVar1 < 0) {
            bVar2 = local_58[1];
            uVar12 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)bVar2 < '\0') {
              auVar21 = google::protobuf::internal::VarintParseSlow64((char *)local_58,uVar12);
              auVar6 = auVar21._0_12_;
            }
            else {
              auVar6._8_4_ = uVar12;
              auVar6._0_8_ = local_58 + 2;
            }
          }
          local_58 = auVar6._0_8_;
          uVar12 = 4;
          this->id_ = auVar6._8_4_;
          goto LAB_00108bc2;
        }
        break;
      case 3:
        if (cVar17 == '\x1a') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar13 = *(Arena **)&this->field_0x8;
          if (((ulong)pAVar13 & 1) != 0) {
            pAVar13 = *(Arena **)((ulong)pAVar13 & 0xfffffffffffffffe);
          }
          if (local_40->ptr_ ==
              (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            google::protobuf::internal::ArenaStringPtr::CreateInstance
                      (local_40,pAVar13,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
            ;
          }
          psVar4 = pAVar8->ptr_;
          local_58 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       ((string *)psVar4,(char *)local_58,ctx);
          pcVar16 = (psVar4->_M_dataplus)._M_p;
          uVar14 = psVar4->_M_string_length;
          if ((long)uVar14 < 0) {
            google::protobuf::StringPiece::LogFatalSizeTooBig(uVar14,"size_t to int conversion");
          }
          pcVar10 = "Messages.Person.email";
          goto LAB_00108a69;
        }
        break;
      case 4:
        if (cVar17 == '\"') {
          local_58 = local_58 + -1;
          do {
            local_58 = local_58 + 1;
            pRVar5 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
            if (pRVar5 == (Rep *)0x0) {
LAB_00108a98:
              google::protobuf::internal::RepeatedPtrFieldBase::Reserve((int)local_38);
LAB_00108aa7:
              pRVar5 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
              pRVar5->allocated_size = pRVar5->allocated_size + 1;
              msg = google::protobuf::Arena::CreateMaybeMessage<Messages::Person_PhoneNumber>
                              ((this->phones_).super_RepeatedPtrFieldBase.arena_);
              pRVar5 = (this->phones_).super_RepeatedPtrFieldBase.rep_;
              iVar3 = (this->phones_).super_RepeatedPtrFieldBase.current_size_;
              (this->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              pRVar5->elements[iVar3] = msg;
            }
            else {
              iVar3 = (this->phones_).super_RepeatedPtrFieldBase.current_size_;
              if (pRVar5->allocated_size <= iVar3) {
                if (pRVar5->allocated_size == (this->phones_).super_RepeatedPtrFieldBase.total_size_
                   ) goto LAB_00108a98;
                goto LAB_00108aa7;
              }
              (this->phones_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
              msg = (Person_PhoneNumber *)pRVar5->elements[iVar3];
            }
            local_58 = (byte *)google::protobuf::internal::ParseContext::
                               ParseMessage<Messages::Person_PhoneNumber>(ctx,msg,(char *)local_58);
            if (local_58 == (byte *)0x0) goto LAB_00108bcc;
          } while ((local_58 < *(byte **)ctx) && (*local_58 == 0x22));
          cVar11 = '\x02';
          goto LAB_00108bcc;
        }
      }
      if (uVar18 == 0 || (uVar18 & 7) == 4) {
        *(uint *)&ctx->field_0x50 = uVar18 - 1;
        cVar11 = '\t';
      }
      else {
        if (((ulong)local_50->ptr_ & 1) == 0) {
          pUVar15 = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_50);
        }
        else {
          pUVar15 = (UnknownFieldSet *)(((ulong)local_50->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_58 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     ((ulong)uVar18,pUVar15,(char *)local_58,ctx);
        cVar11 = (local_58 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00108bcc:
  } while (cVar11 == '\x02');
  if (cVar11 == '\x04') {
    local_58 = (byte *)0x0;
  }
LAB_00108c0b:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
  return (char *)local_58;
}

Assistant:

const char* Person::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // required string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.name");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // required int32 id = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_id(&has_bits);
          id_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string email = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          auto str = _internal_mutable_email();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "Messages.Person.email");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .Messages.Person.PhoneNumber phones = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_phones(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}